

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexTools.cpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> *
IndexTools::JointToIndividualIndicesStepSize
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,Index jointI,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *step_size,size_t vec_size)

{
  pointer puVar1;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  uint *__first;
  ulong uVar6;
  undefined8 uStack_20;
  uint uStack_18;
  allocator_type local_11;
  
  lVar3 = -(vec_size * 4 + 0xf & 0xfffffffffffffff0);
  __first = (uint *)((long)&uStack_18 + lVar3);
  puVar1 = (step_size->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar5 = 0; uVar6 = (ulong)uVar5, uVar6 < vec_size; uVar5 = uVar5 + 1) {
    uVar2 = puVar1[uVar6];
    uVar4 = (uint)(jointI / uVar2);
    __first[uVar6] = uVar4;
    jointI = jointI - (int)uVar2 * uVar4;
  }
  *(undefined8 *)((long)&uStack_20 + lVar3) = 0x4ce9bb;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::vector<unsigned_int*,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__,__first,
             __first + vec_size,&local_11);
  return __return_storage_ptr__;
}

Assistant:

vector<Index> IndexTools::JointToIndividualIndicesStepSize(
        Index jointI, 
        const vector<size_t> &step_size, 
        size_t vec_size  
    )
{
    Index remainder = jointI;

    Index resultArr[vec_size];
    for(Index i=0; i < vec_size ; i++)
    {
        Index aI = remainder / step_size[i];
        resultArr[i] = aI;//store this indiv. index
        //remainder = remainder %  step_size[i];
        remainder -= step_size[i] * aI;
    }
    vector<Index> result(&resultArr[0], &resultArr[vec_size]);
    return(result);
}